

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O2

bool __thiscall libchars::history::prev(history *this)

{
  if (this[8] == (history)0x0) {
    if (*(history **)(this + 0x30) != this + 0x30) {
      *(undefined8 *)(this + 0x48) = *(undefined8 *)(this + 0x38);
      this[0x50] = (history)0x0;
      this[8] = (history)0x1;
      return true;
    }
  }
  else if (*(long *)(this + 0x48) != *(long *)(this + 0x30)) {
    *(undefined8 *)(this + 0x48) = *(undefined8 *)(*(long *)(this + 0x48) + 8);
    return true;
  }
  return false;
}

Assistant:

bool history::prev()
    {
        if (!busy) {
            if (lines.empty()) {
                return false;
            }
            else {
                // use last value in list
                li = lines.end();
                --li;
                overflow = false;
                busy = true;
                return true;
            }
        }
        else {
            if (li == lines.begin()) {
                // stay on current value
                return false;
            }
            else {
                // use previous value
                --li;
                return true;
            }
        }
    }